

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_PackageAlreadyDefined_Test::
~ValidationErrorTest_PackageAlreadyDefined_Test
          (ValidationErrorTest_PackageAlreadyDefined_Test *this)

{
  ValidationErrorTest_PackageAlreadyDefined_Test *this_local;
  
  ~ValidationErrorTest_PackageAlreadyDefined_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, PackageAlreadyDefined) {
  BuildFile(
      "name: \"foo.proto\" "
      "message_type { name: \"foo\" }");
  BuildFileWithErrors(
      "name: \"bar.proto\" "
      "package: \"foo.bar\"",

      "bar.proto: foo: NAME: \"foo\" is already defined (as something other "
      "than a package) in file \"foo.proto\".\n");
}